

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

xmlTextWriterPtr xmlNewTextWriterDoc(xmlDocPtr *doc,int compression)

{
  xmlParserCtxtPtr ctxt;
  xmlDocPtr pxVar1;
  xmlTextWriterPtr pxVar2;
  char *msg;
  int compression_00;
  xmlSAXHandler saxHandler;
  
  memset(&saxHandler,0,0x100);
  xmlSAX2InitDefaultSAXHandler(&saxHandler,1);
  saxHandler.startDocument = xmlTextWriterStartDocumentCallback;
  saxHandler.startElement = xmlSAX2StartElement;
  saxHandler.endElement = xmlSAX2EndElement;
  compression_00 = 0;
  ctxt = xmlCreatePushParserCtxt(&saxHandler,(void *)0x0,(char *)0x0,0,(char *)0x0);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    msg = "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n";
  }
  else {
    ctxt->dictNames = 0;
    pxVar1 = xmlNewDoc("1.0");
    ctxt->myDoc = pxVar1;
    if (pxVar1 == (xmlDocPtr)0x0) {
      xmlFreeParserCtxt(ctxt);
      msg = "xmlNewTextWriterDoc : error at xmlNewDoc!\n";
    }
    else {
      pxVar2 = xmlNewTextWriterPushParser(ctxt,compression_00);
      if (pxVar2 != (xmlTextWriterPtr)0x0) {
        xmlSetDocCompressMode(ctxt->myDoc,compression);
        if (doc == (xmlDocPtr *)0x0) {
          return pxVar2;
        }
        *doc = ctxt->myDoc;
        pxVar2->no_doc_free = 1;
        return pxVar2;
      }
      xmlFreeDoc(ctxt->myDoc);
      xmlFreeParserCtxt(ctxt);
      msg = "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n";
    }
  }
  xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,msg);
  return (xmlTextWriterPtr)0x0;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterDoc(xmlDocPtr * doc, int compression)
{
    xmlTextWriterPtr ret;
    xmlSAXHandler saxHandler;
    xmlParserCtxtPtr ctxt;

    memset(&saxHandler, '\0', sizeof(saxHandler));
    xmlSAX2InitDefaultSAXHandler(&saxHandler, 1);
    saxHandler.startDocument = xmlTextWriterStartDocumentCallback;
    saxHandler.startElement = xmlSAX2StartElement;
    saxHandler.endElement = xmlSAX2EndElement;

    ctxt = xmlCreatePushParserCtxt(&saxHandler, NULL, NULL, 0, NULL);
    if (ctxt == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n");
        return NULL;
    }
    /*
     * For some reason this seems to completely break if node names
     * are interned.
     */
    ctxt->dictNames = 0;

    ctxt->myDoc = xmlNewDoc(BAD_CAST XML_DEFAULT_VERSION);
    if (ctxt->myDoc == NULL) {
        xmlFreeParserCtxt(ctxt);
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlNewDoc!\n");
        return NULL;
    }

    ret = xmlNewTextWriterPushParser(ctxt, compression);
    if (ret == NULL) {
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n");
        return NULL;
    }

    xmlSetDocCompressMode(ctxt->myDoc, compression);

    if (doc != NULL) {
        *doc = ctxt->myDoc;
	ret->no_doc_free = 1;
    }

    return ret;
}